

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void kj::_::stripLeadingAndTrailingSpace(ArrayPtr<const_char> *str)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  ArrayPtr<const_char> AVar4;
  char *local_30;
  size_t local_28;
  char *local_20;
  size_t local_18;
  ArrayPtr<const_char> *str_local;
  
  while( true ) {
    sVar1 = ArrayPtr<const_char>::size(str);
    bVar3 = false;
    if (sVar1 != 0) {
      pcVar2 = ArrayPtr<const_char>::operator[](str,0);
      bVar3 = true;
      if (*pcVar2 != ' ') {
        pcVar2 = ArrayPtr<const_char>::operator[](str,0);
        bVar3 = *pcVar2 == '\t';
      }
    }
    if (!bVar3) break;
    sVar1 = ArrayPtr<const_char>::size(str);
    AVar4 = ArrayPtr<const_char>::slice(str,1,sVar1);
    local_20 = AVar4.ptr;
    str->ptr = local_20;
    local_18 = AVar4.size_;
    str->size_ = local_18;
  }
  while( true ) {
    sVar1 = ArrayPtr<const_char>::size(str);
    bVar3 = false;
    if (sVar1 != 0) {
      pcVar2 = ArrayPtr<const_char>::back(str);
      bVar3 = true;
      if (*pcVar2 != ' ') {
        pcVar2 = ArrayPtr<const_char>::back(str);
        bVar3 = *pcVar2 == '\t';
      }
    }
    if (!bVar3) break;
    sVar1 = ArrayPtr<const_char>::size(str);
    AVar4 = ArrayPtr<const_char>::first(str,sVar1 - 1);
    local_30 = AVar4.ptr;
    str->ptr = local_30;
    local_28 = AVar4.size_;
    str->size_ = local_28;
  }
  return;
}

Assistant:

void stripLeadingAndTrailingSpace(ArrayPtr<const char>& str) {
  // Remove any leading/trailing spaces from `str`, modifying it in-place.
  while (str.size() > 0 && (str[0] == ' ' || str[0] == '\t')) {
    str = str.slice(1, str.size());
  }
  while (str.size() > 0 && (str.back() == ' ' || str.back() == '\t')) {
    str = str.first(str.size() - 1);
  }
}